

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_read(Curl_easy *data,curl_socket_t sockfd,char *buf,size_t sizerequested,ssize_t *n)

{
  connectdata *pcVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t local_70;
  int num;
  connectdata *conn;
  char *buffertofill;
  size_t bytesfromsocket;
  ssize_t nread;
  ssize_t *psStack_38;
  CURLcode result;
  ssize_t *n_local;
  size_t sizerequested_local;
  char *buf_local;
  Curl_easy *pCStack_18;
  curl_socket_t sockfd_local;
  Curl_easy *data_local;
  
  nread._4_4_ = CURLE_RECV_ERROR;
  pcVar1 = data->conn;
  uVar2 = (uint)(sockfd == pcVar1->sock[1]);
  *n = 0;
  local_70 = sizerequested;
  if ((data->set).buffer_size <= sizerequested) {
    local_70 = (size_t)(data->set).buffer_size;
  }
  psStack_38 = n;
  n_local = (ssize_t *)sizerequested;
  sizerequested_local = (size_t)buf;
  buf_local._4_4_ = sockfd;
  pCStack_18 = data;
  sVar3 = (*pcVar1->recv[(int)uVar2])(data,uVar2,buf,local_70,(CURLcode *)((long)&nread + 4));
  if (sVar3 < 0) {
    data_local._4_4_ = nread._4_4_;
  }
  else {
    *psStack_38 = sVar3 + *psStack_38;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_read(struct Curl_easy *data,   /* transfer */
                   curl_socket_t sockfd,     /* read from this socket */
                   char *buf,                /* store read data here */
                   size_t sizerequested,     /* max amount to read */
                   ssize_t *n)               /* amount bytes read */
{
  CURLcode result = CURLE_RECV_ERROR;
  ssize_t nread = 0;
  size_t bytesfromsocket = 0;
  char *buffertofill = NULL;
  struct connectdata *conn = data->conn;

  /* Set 'num' to 0 or 1, depending on which socket that has been sent here.
     If it is the second socket, we set num to 1. Otherwise to 0. This lets
     us use the correct ssl handle. */
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  *n = 0; /* reset amount to zero */

  bytesfromsocket = CURLMIN(sizerequested, (size_t)data->set.buffer_size);
  buffertofill = buf;

  nread = conn->recv[num](data, num, buffertofill, bytesfromsocket, &result);
  if(nread < 0)
    return result;

  *n += nread;

  return CURLE_OK;
}